

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,Message *from)

{
  CodeGeneratorResponse_File *pCVar1;
  Message *in_RDI;
  CodeGeneratorResponse_File *source;
  CodeGeneratorResponse_File *in_stack_00000028;
  CodeGeneratorResponse_File *in_stack_00000030;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pCVar1 = DynamicCastToGenerated<google::protobuf::compiler::CodeGeneratorResponse_File>(in_RDI);
  if (pCVar1 == (CodeGeneratorResponse_File *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  GOOGLE_DCHECK_NE(&from, this);
  const CodeGeneratorResponse_File* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<CodeGeneratorResponse_File>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.compiler.CodeGeneratorResponse.File)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.compiler.CodeGeneratorResponse.File)
    MergeFrom(*source);
  }
}